

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

int check_neighbor_blocks(MB_MODE_INFO **mi,int mi_stride,TileInfo *tile_info,int mi_row,int mi_col)

{
  ulong uVar1;
  MB_MODE_INFO *pMVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  short sVar10;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  uVar7 = 1;
  uVar9 = 1;
  if ((tile_info->mi_row_start < mi_row) && (pMVar2 = mi[-mi_stride], 0xc < pMVar2->mode)) {
    uVar1 = *(ulong *)pMVar2->mv;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar1;
    sVar10 = (short)uVar1;
    sVar3 = -sVar10;
    sVar17 = (short)(uVar1 >> 0x10);
    sVar4 = -sVar17;
    sVar18 = (short)(uVar1 >> 0x20);
    sVar5 = -sVar18;
    sVar19 = (short)(uVar1 >> 0x30);
    sVar6 = -sVar19;
    auVar20._0_2_ = (ushort)(sVar3 < sVar10) * sVar10 | (ushort)(sVar3 >= sVar10) * sVar3;
    auVar20._2_2_ = (ushort)(sVar4 < sVar17) * sVar17 | (ushort)(sVar4 >= sVar17) * sVar4;
    auVar20._4_2_ = (ushort)(sVar5 < sVar18) * sVar18 | (ushort)(sVar5 >= sVar18) * sVar5;
    auVar20._6_2_ = (ushort)(sVar6 < sVar19) * sVar19 | (ushort)(sVar6 >= sVar19) * sVar6;
    auVar20._8_8_ = 0;
    auVar11 = pshuflw(auVar11,auVar20,0x50);
    auVar12._0_4_ = auVar11._0_4_;
    auVar12._4_4_ = auVar12._0_4_;
    auVar12._8_4_ = auVar11._4_4_;
    auVar12._12_4_ = auVar11._4_4_;
    auVar12 = auVar12 ^ _DAT_004d29e0;
    auVar13._0_2_ = -(ushort)(-0x7fe8 < auVar12._0_2_);
    auVar13._2_2_ = -(ushort)(-0x7fe8 < auVar12._2_2_);
    auVar13._4_2_ = -(ushort)(-0x7fe8 < auVar12._4_2_);
    auVar13._6_2_ = -(ushort)(-0x7fe8 < auVar12._6_2_);
    auVar13._8_2_ = -(ushort)(-0x7fe8 < auVar12._8_2_);
    auVar13._10_2_ = -(ushort)(-0x7fe8 < auVar12._10_2_);
    auVar13._12_2_ = -(ushort)(-0x7fe8 < auVar12._12_2_);
    auVar13._14_2_ = -(ushort)(-0x7fe8 < auVar12._14_2_);
    iVar8 = movmskpd((int)pMVar2,auVar13);
    uVar9 = (uint)(iVar8 == 0);
  }
  if ((tile_info->mi_col_start < mi_col) && (pMVar2 = mi[-1], 0xc < pMVar2->mode)) {
    uVar1 = *(ulong *)pMVar2->mv;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar1;
    sVar10 = (short)uVar1;
    sVar3 = -sVar10;
    sVar17 = (short)(uVar1 >> 0x10);
    sVar4 = -sVar17;
    sVar18 = (short)(uVar1 >> 0x20);
    sVar5 = -sVar18;
    sVar19 = (short)(uVar1 >> 0x30);
    sVar6 = -sVar19;
    auVar21._0_2_ = (ushort)(sVar3 < sVar10) * sVar10 | (ushort)(sVar3 >= sVar10) * sVar3;
    auVar21._2_2_ = (ushort)(sVar4 < sVar17) * sVar17 | (ushort)(sVar4 >= sVar17) * sVar4;
    auVar21._4_2_ = (ushort)(sVar5 < sVar18) * sVar18 | (ushort)(sVar5 >= sVar18) * sVar5;
    auVar21._6_2_ = (ushort)(sVar6 < sVar19) * sVar19 | (ushort)(sVar6 >= sVar19) * sVar6;
    auVar21._8_8_ = 0;
    auVar11 = pshuflw(auVar14,auVar21,0x50);
    auVar15._0_4_ = auVar11._0_4_;
    auVar15._4_4_ = auVar15._0_4_;
    auVar15._8_4_ = auVar11._4_4_;
    auVar15._12_4_ = auVar11._4_4_;
    auVar15 = auVar15 ^ _DAT_004d29e0;
    auVar16._0_2_ = -(ushort)(-0x7fe8 < auVar15._0_2_);
    auVar16._2_2_ = -(ushort)(-0x7fe8 < auVar15._2_2_);
    auVar16._4_2_ = -(ushort)(-0x7fe8 < auVar15._4_2_);
    auVar16._6_2_ = -(ushort)(-0x7fe8 < auVar15._6_2_);
    auVar16._8_2_ = -(ushort)(-0x7fe8 < auVar15._8_2_);
    auVar16._10_2_ = -(ushort)(-0x7fe8 < auVar15._10_2_);
    auVar16._12_2_ = -(ushort)(-0x7fe8 < auVar15._12_2_);
    auVar16._14_2_ = -(ushort)(-0x7fe8 < auVar15._14_2_);
    iVar8 = movmskpd((int)pMVar2,auVar16);
    uVar7 = (uint)(iVar8 == 0);
  }
  return uVar7 & uVar9;
}

Assistant:

static int check_neighbor_blocks(MB_MODE_INFO **mi, int mi_stride,
                                 const TileInfo *const tile_info, int mi_row,
                                 int mi_col) {
  int is_above_low_motion = 1;
  int is_left_low_motion = 1;
  const int thr = 24;

  // Check above block.
  if (mi_row > tile_info->mi_row_start) {
    const MB_MODE_INFO *above_mbmi = mi[-mi_stride];
    const int_mv above_mv = above_mbmi->mv[0];
    if (above_mbmi->mode >= INTRA_MODE_END &&
        (abs(above_mv.as_mv.row) > thr || abs(above_mv.as_mv.col) > thr))
      is_above_low_motion = 0;
  }

  // Check left block.
  if (mi_col > tile_info->mi_col_start) {
    const MB_MODE_INFO *left_mbmi = mi[-1];
    const int_mv left_mv = left_mbmi->mv[0];
    if (left_mbmi->mode >= INTRA_MODE_END &&
        (abs(left_mv.as_mv.row) > thr || abs(left_mv.as_mv.col) > thr))
      is_left_low_motion = 0;
  }

  return (is_above_low_motion && is_left_low_motion);
}